

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall soplex::SLUFactor<double>::SLUFactor(SLUFactor<double> *this)

{
  SPxOut *__new_size;
  Timer *pTVar1;
  SPxOut *pSVar2;
  SLinSolver<double> *in_RDI;
  SPxMemoryException *x;
  nullptr_t in_stack_ffffffffffffff48;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int iVar3;
  VectorBase<double> *in_stack_ffffffffffffff60;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff70;
  SLUFactor<double> *this_00;
  undefined8 in_stack_ffffffffffffff78;
  int p_dim;
  CLUFactor<double> *in_stack_ffffffffffffff80;
  SSVectorBase<double> *this_01;
  int n;
  SPxOut **p;
  undefined1 local_48 [16];
  undefined1 local_38 [56];
  
  p_dim = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  SLinSolver<double>::SLinSolver(in_RDI);
  CLUFactor<double>::CLUFactor(in_stack_ffffffffffffff80);
  in_RDI->_vptr_SLinSolver = (_func_int **)&PTR_getName_004ec568;
  VectorBase<double>::VectorBase(in_stack_ffffffffffffff60,iVar3);
  p = &in_RDI[0x27].spxout;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SSVectorBase<double>::SSVectorBase
            ((SSVectorBase<double> *)in_stack_ffffffffffffff80,p_dim,in_stack_ffffffffffffff70);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x231c95);
  *(undefined1 *)&in_RDI[0x2c].spxout = 0;
  *(undefined4 *)((long)&in_RDI[0x2c].spxout + 4) = 1;
  this_01 = (SSVectorBase<double> *)(in_RDI + 0x2d);
  n = (int)((ulong)local_38 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SSVectorBase<double>::SSVectorBase(this_01,p_dim,in_stack_ffffffffffffff70);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x231cef);
  this_00 = (SLUFactor<double> *)(in_RDI + 0x32);
  iVar3 = (int)((ulong)local_48 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SSVectorBase<double>::SSVectorBase(this_01,iVar3,(shared_ptr<soplex::Tolerances> *)this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x231d32);
  in_RDI[0x37].spxout = (SPxOut *)0x3f847ae147ae147b;
  *(undefined4 *)&in_RDI[0x39]._vptr_SLinSolver = 1;
  in_RDI[5]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[4].spxout = (SPxOut *)0x0;
  in_RDI[6]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[5].spxout = (SPxOut *)0x0;
  in_RDI[0x12]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x14].spxout = (SPxOut *)0x0;
  in_RDI[0x15]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x15].spxout = (SPxOut *)0x0;
  in_RDI[0x16]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x18]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x19]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x1b]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0x1b].spxout = (SPxOut *)0x0;
  in_RDI[0x1c]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[8].spxout = (SPxOut *)0x0;
  in_RDI[10]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[10].spxout = (SPxOut *)0x0;
  in_RDI[0xd]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0xd].spxout = (SPxOut *)0x0;
  in_RDI[0xe]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0xe].spxout = (SPxOut *)0x0;
  *(undefined4 *)&in_RDI[1].spxout = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4) = 0;
  __new_size = (SPxOut *)TimerFactory::createTimer((TYPE)((ulong)this_00 >> 0x20));
  in_RDI[0x38].spxout = __new_size;
  pTVar1 = TimerFactory::createTimer((TYPE)((ulong)this_00 >> 0x20));
  in_RDI[0x1d]._vptr_SLinSolver = (_func_int **)pTVar1;
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,(size_type)__new_size);
  pSVar2 = (SPxOut *)VectorBase<double>::get_ptr((VectorBase<double> *)0x231eff);
  in_RDI[0x1c].spxout = pSVar2;
  *(undefined4 *)&in_RDI[0x12].spxout = 1;
  *(undefined4 *)((long)&in_RDI[0x12].spxout + 4) = 0;
  spx_alloc<soplex::CLUFactor<double>::Dring*>((Dring **)p,n);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,(size_type)__new_size);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[0x11].spxout = *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4);
  *(undefined4 *)
   ((long)in_RDI[0x15]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)
   ((long)in_RDI[0x16]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)
   ((long)&(in_RDI[0x15].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)&in_RDI[0x18].spxout = 1;
  *(undefined4 *)((long)&in_RDI[0x18].spxout + 4) = 0;
  spx_alloc<soplex::CLUFactor<double>::Dring*>((Dring **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[0x17].spxout = *(undefined4 *)((long)&in_RDI[1]._vptr_SLinSolver + 4);
  *(undefined4 *)
   ((long)in_RDI[0x1b]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)
   ((long)in_RDI[0x1c]._vptr_SLinSolver + (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4)
       = 0;
  *(undefined4 *)
   ((long)&(in_RDI[0x1b].spxout)->_vptr_SPxOut +
   (long)*(int *)((long)&in_RDI[1]._vptr_SLinSolver + 4) * 4) = 0;
  *(undefined4 *)&in_RDI[6].spxout = 1;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this_00,(size_type)__new_size);
  spx_alloc<int*>((int **)p,n);
  *(undefined4 *)&in_RDI[9]._vptr_SLinSolver = 1;
  *(undefined4 *)((long)&in_RDI[9]._vptr_SLinSolver + 4) = 0;
  *(undefined4 *)&in_RDI[9].spxout = 0;
  spx_alloc<int*>((int **)p,n);
  spx_alloc<int*>((int **)p,n);
  in_RDI[0xd]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0xd].spxout = (SPxOut *)0x0;
  in_RDI[0xe]._vptr_SLinSolver = (_func_int **)0x0;
  in_RDI[0xe].spxout = (SPxOut *)0x0;
  clear(this_00);
  *(undefined4 *)&in_RDI[0x1d].spxout = 0;
  *(undefined4 *)((long)&in_RDI[0x1d].spxout + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0x39]._vptr_SLinSolver + 4) = 0;
  return;
}

Assistant:

SLUFactor<R>::SLUFactor()
   : vec(1)
   , ssvec(1)
   , usetup(false)
   , uptype(FOREST_TOMLIN)
   , eta(1)
   , forest(1)
   , minThreshold(0.01)
   , timerType(Timer::USER_TIME)
{
   this->row.perm    = nullptr;
   this->row.orig    = nullptr;
   this->col.perm    = nullptr;
   this->col.orig    = nullptr;
   this->u.row.elem  = nullptr;
   this->u.row.idx   = nullptr;
   this->u.row.start = nullptr;
   this->u.row.len   = nullptr;
   this->u.row.max   = nullptr;
   this->u.col.elem  = nullptr;
   this->u.col.idx   = nullptr;
   this->u.col.start = nullptr;
   this->u.col.len   = nullptr;
   this->u.col.max   = nullptr;
   this->l.idx       = nullptr;
   this->l.start     = nullptr;
   this->l.row       = nullptr;
   this->l.ridx      = nullptr;
   this->l.rbeg      = nullptr;
   this->l.rorig     = nullptr;
   this->l.rperm     = nullptr;

   this->nzCnt  = 0;
   this->thedim = 0;

   try
   {
      solveTime = TimerFactory::createTimer(timerType);
      this->factorTime = TimerFactory::createTimer(timerType);
      spx_alloc(this->row.perm, this->thedim);
      spx_alloc(this->row.orig, this->thedim);
      spx_alloc(this->col.perm, this->thedim);
      spx_alloc(this->col.orig, this->thedim);

      this->diag.resize(this->thedim);

      this->work = vec.get_ptr();

      this->u.row.size = 1;
      this->u.row.used = 0;
      spx_alloc(this->u.row.elem,  this->thedim);
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx,   this->u.row.size);
      spx_alloc(this->u.row.start, this->thedim + 1);
      spx_alloc(this->u.row.len,   this->thedim + 1);
      spx_alloc(this->u.row.max,   this->thedim + 1);

      this->u.row.list.idx      = this->thedim;
      this->u.row.start[this->thedim] = 0;
      this->u.row.max  [this->thedim] = 0;
      this->u.row.len  [this->thedim] = 0;

      this->u.col.size = 1;
      this->u.col.used = 0;
      spx_alloc(this->u.col.elem,  this->thedim);
      spx_alloc(this->u.col.idx,   this->u.col.size);
      spx_alloc(this->u.col.start, this->thedim + 1);
      spx_alloc(this->u.col.len,   this->thedim + 1);
      spx_alloc(this->u.col.max,   this->thedim + 1);

      this->u.col.list.idx      = this->thedim;
      this->u.col.start[this->thedim] = 0;
      this->u.col.max[this->thedim]   = 0;
      this->u.col.len[this->thedim]   = 0;

      this->l.size = 1;

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx, this->l.size);

      this->l.startSize   = 1;
      this->l.firstUpdate = 0;
      this->l.firstUnused = 0;

      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }

   this->l.ridx  = nullptr;
   this->l.rbeg  = nullptr;
   this->l.rorig = nullptr;
   this->l.rperm = nullptr;

   SLUFactor<R>::clear(); // clear() is virtual

   this->factorCount = 0;
   this->hugeValues = 0;
   solveCount  = 0;
   assert(this->row.perm != nullptr);

   assert(this->row.orig != nullptr);
   assert(this->col.perm != nullptr);
   assert(this->col.orig != nullptr);

   assert(this->u.row.elem  != nullptr);
   assert(this->u.row.idx   != nullptr);
   assert(this->u.row.start != nullptr);
   assert(this->u.row.len   != nullptr);
   assert(this->u.row.max   != nullptr);

   assert(this->u.col.elem  != nullptr);
   assert(this->u.col.idx   != nullptr);
   assert(this->u.col.start != nullptr);
   assert(this->u.col.len   != nullptr);
   assert(this->u.col.max   != nullptr);

   assert(this->l.idx   != nullptr);
   assert(this->l.start != nullptr);
   assert(this->l.row   != nullptr);

   assert(SLUFactor<R>::isConsistent());
}